

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

void __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FindAllFileNames
          (DescriptorIndex *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *output)

{
  pointer pFVar1;
  pointer pcVar2;
  bool bVar3;
  reference pFVar4;
  uint uVar5;
  FileEntry *entry;
  pointer pFVar6;
  ulong uVar7;
  long lVar8;
  const_iterator other;
  const_iterator cVar9;
  long *local_70 [2];
  long local_60 [2];
  DescriptorIndex *local_50;
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
  *local_48;
  btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
  local_40;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(output,((long)(this->by_name_flat_).
                         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->by_name_flat_).
                         super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 +
                  (this->by_name_).
                  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                  .
                  super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                  .tree_.size_);
  cVar9 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
          ::begin((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                   *)&this->by_name_);
  local_40.node_ = cVar9.node_;
  local_40.position_ = cVar9.position_;
  cVar9 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
          ::end((btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                 *)&this->by_name_);
  local_48 = cVar9.node_;
  other.position_ = cVar9.position_;
  bVar3 = absl::lts_20250127::container_internal::
          btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
          ::Equals(&local_40,cVar9);
  if (bVar3) {
    uVar7 = 0;
  }
  else {
    lVar8 = 0;
    uVar5 = 0;
    local_50 = this;
    do {
      pFVar4 = absl::lts_20250127::container_internal::
               btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
               ::operator*(&local_40);
      pcVar2 = (pFVar4->encoded_name)._M_dataplus._M_p;
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,pcVar2,pcVar2 + (pFVar4->encoded_name)._M_string_length);
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&(((output->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8),
                 (string *)local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      uVar5 = uVar5 + 1;
      absl::lts_20250127::container_internal::
      btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
      ::increment(&local_40);
      other.node_ = local_48;
      other._12_4_ = 0;
      bVar3 = absl::lts_20250127::container_internal::
              btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
              ::Equals(&local_40,other);
      lVar8 = lVar8 + 0x20;
    } while (!bVar3);
    uVar7 = (ulong)uVar5;
    this = local_50;
  }
  pFVar6 = (this->by_name_flat_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->by_name_flat_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar6 != pFVar1) {
    lVar8 = uVar7 << 5;
    do {
      pcVar2 = (pFVar6->encoded_name)._M_dataplus._M_p;
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,pcVar2,pcVar2 + (pFVar6->encoded_name)._M_string_length);
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&(((output->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8),
                 (string *)local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      pFVar6 = pFVar6 + 1;
      lVar8 = lVar8 + 0x20;
    } while (pFVar6 != pFVar1);
  }
  return;
}

Assistant:

void EncodedDescriptorDatabase::DescriptorIndex::FindAllFileNames(
    std::vector<std::string>* PROTOBUF_NONNULL output) const {
  output->resize(by_name_.size() + by_name_flat_.size());
  int i = 0;
  for (const auto& entry : by_name_) {
    (*output)[i] = std::string(entry.name(*this));
    i++;
  }
  for (const auto& entry : by_name_flat_) {
    (*output)[i] = std::string(entry.name(*this));
    i++;
  }
}